

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.hpp
# Opt level: O0

Result __thiscall
Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RealConstantType>>
          (LAKBO *this,Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *t0,
          Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *t1)

{
  uint uVar1;
  Result RVar2;
  anon_class_1_0_00000001 set;
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffff50;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffff58;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffff60;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffff80;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff88;
  
  uVar1 = Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::nSummands
                    ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x8f2d39);
  if ((uVar1 == 1) &&
     (uVar1 = Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::nSummands
                        ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x8f2d4b),
     uVar1 == 1)) {
    Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::summandAt
              ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff1c);
    Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::summandAt
              ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff1c);
    RVar2 = cmpSameSkeleton<Kernel::NumTraits<Kernel::RealConstantType>>
                      (in_stack_ffffffffffffff60.this,in_stack_ffffffffffffff58,
                       in_stack_ffffffffffffff50);
    return RVar2;
  }
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  const::{lambda(auto:1)#1}::operator()(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  const::{lambda(auto:1)#1}::operator()(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  RVar2 = OrderingUtils::
          mulExt<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>const&,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>const&)const::_lambda(auto:1&,auto:2&)_1_>
                    ((MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                     in_stack_ffffffffffffff58,
                     (MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                     in_stack_ffffffffffffff50,in_stack_ffffffffffffff60);
  MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~MultiSet
            ((MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)0x8f2e30);
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x8f2e3a);
  MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~MultiSet
            ((MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)0x8f2e47);
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x8f2e54);
  return RVar2;
}

Assistant:

Ordering::Result cmpSameSkeleton(Polynom<NumTraits> const& t0, Polynom<NumTraits> const& t1) const 
  { 
    if (t0.nSummands() == 1 && t1.nSummands() == 1) {
      return cmpSameSkeleton(t0.summandAt(0), t1.summandAt(0));
    } else {
      auto set = [](auto p) { return p.iterSummands().map([](auto& x) { return x; }).template collect<MultiSet>(); };
      return OrderingUtils::mulExt(set(t0), set(t1), [&](auto& l, auto& r) { return compare(l, r); });
    }
  }